

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qotd.cc
# Opt level: O2

void unescapeQuote(string *quote)

{
  ulong uVar1;
  string replacement;
  string target;
  allocator local_61;
  allocator local_60 [32];
  string local_40 [8];
  string *local_38;
  
  std::__cxx11::string::string(local_40,"\\n",local_60);
  std::__cxx11::string::string((string *)local_60,"\n",&local_61);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)quote,(ulong)local_40);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)quote,uVar1,local_38);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void unescapeQuote( std::string& quote )
{
  std::size_t position    = 0;
  std::string target      = "\\n";
  std::string replacement = "\n";
  while( ( position = quote.find( target, position ) ) != std::string::npos )
  {
    quote.replace( position, target.length(), replacement );
    position += replacement.length();
  }
}